

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_int_const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_int>
          (ExpressionLhs<unsigned_int_const&> *this,uint *rhs)

{
  ResultBuilder *pRVar1;
  uint value;
  uint value_00;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = ResultBuilder::setResultType(*(ResultBuilder **)this,**(uint **)(this + 8) == *rhs);
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)**(uint **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)(ulong)*rhs,value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }